

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O0

void load_intel_features(cpu_raw_data_t *raw,cpu_id_t *data)

{
  feature_map_t local_d8;
  feature_map_t matchtable_ebx7 [5];
  feature_map_t matchtable_edx81 [1];
  feature_map_t matchtable_ecx1 [10];
  feature_map_t matchtable_edx1 [7];
  cpu_id_t *data_local;
  cpu_raw_data_t *raw_local;
  
  memcpy(matchtable_ecx1 + 9,&DAT_00133520,0x38);
  memcpy(matchtable_edx81,&DAT_00133560,0x50);
  matchtable_ebx7[4].bit = 0x14;
  matchtable_ebx7[4].feature = CPU_FEATURE_XD;
  memcpy(&local_d8,&DAT_001335b0,0x28);
  if (raw->basic_cpuid[0][0] != 0) {
    match_features(matchtable_ecx1 + 9,7,raw->basic_cpuid[1][3],data);
    match_features(matchtable_edx81,10,raw->basic_cpuid[1][2],data);
  }
  if (raw->ext_cpuid[0][0] != 0) {
    match_features(matchtable_ebx7 + 4,1,raw->ext_cpuid[1][3],data);
  }
  if (6 < raw->basic_cpuid[0][0]) {
    match_features(&local_d8,5,raw->basic_cpuid[7][1],data);
  }
  return;
}

Assistant:

static void load_intel_features(struct cpu_raw_data_t* raw, struct cpu_id_t* data)
{
	const struct feature_map_t matchtable_edx1[] = {
		{ 18, CPU_FEATURE_PN },
		{ 21, CPU_FEATURE_DTS },
		{ 22, CPU_FEATURE_ACPI },
		{ 27, CPU_FEATURE_SS },
		{ 29, CPU_FEATURE_TM },
		{ 30, CPU_FEATURE_IA64 },
		{ 31, CPU_FEATURE_PBE },
	};
	const struct feature_map_t matchtable_ecx1[] = {
		{  2, CPU_FEATURE_DTS64 },
		{  4, CPU_FEATURE_DS_CPL },
		{  5, CPU_FEATURE_VMX },
		{  6, CPU_FEATURE_SMX },
		{  7, CPU_FEATURE_EST },
		{  8, CPU_FEATURE_TM2 },
		{ 10, CPU_FEATURE_CID },
		{ 14, CPU_FEATURE_XTPR },
		{ 15, CPU_FEATURE_PDCM },
		{ 18, CPU_FEATURE_DCA },
		/* id 21 is handled in common */
	};
	const struct feature_map_t matchtable_edx81[] = {
		{ 20, CPU_FEATURE_XD },
	};
	const struct feature_map_t matchtable_ebx7[] = {
		{  2, CPU_FEATURE_SGX },
		{  4, CPU_FEATURE_HLE },
		{ 11, CPU_FEATURE_RTM },
		/* id 16 to 19 are handled in common */
		{ 26, CPU_FEATURE_AVX512PF },
		{ 27, CPU_FEATURE_AVX512ER },
		/* id 28 to 31 are handled in common */
	};

	if (raw->basic_cpuid[0][EAX] >= 1) {
		match_features(matchtable_edx1, COUNT_OF(matchtable_edx1), raw->basic_cpuid[1][EDX], data);
		match_features(matchtable_ecx1, COUNT_OF(matchtable_ecx1), raw->basic_cpuid[1][ECX], data);
	}
	if (raw->ext_cpuid[0][EAX] >= 1) {
		match_features(matchtable_edx81, COUNT_OF(matchtable_edx81), raw->ext_cpuid[1][EDX], data);
	}
	// detect TSX/AVX512:
	if (raw->basic_cpuid[0][EAX] >= 7) {
		match_features(matchtable_ebx7, COUNT_OF(matchtable_ebx7), raw->basic_cpuid[7][EBX], data);
	}
}